

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O3

size_t luaO_str2num(char *s,TValue *o)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  char *pcVar4;
  size_t sVar5;
  lconv *plVar6;
  lu_byte lVar7;
  int iVar8;
  int mode;
  int mode_00;
  lua_Number lVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  lua_Number n;
  lua_Number local_100;
  char local_f8 [216];
  
  pbVar3 = (byte *)s;
  do {
    pbVar2 = pbVar3;
    bVar10 = *pbVar2;
    uVar12 = (ulong)bVar10;
    pbVar3 = pbVar2 + 1;
  } while ((""[uVar12 + 1] & 8) != 0);
  if (bVar10 == 0x2b) {
    iVar8 = 0;
LAB_00112f55:
    uVar12 = (ulong)*pbVar3;
  }
  else {
    iVar8 = 1;
    if (bVar10 == 0x2d) goto LAB_00112f55;
    iVar8 = 0;
    pbVar3 = pbVar2;
  }
  if (((char)uVar12 == '0') && ((pbVar3[1] | 0x20) == 0x78)) {
    uVar12 = (ulong)pbVar3[2];
    pbVar3 = pbVar3 + 2;
    if ((""[uVar12 + 1] & 0x10) == 0) goto LAB_00112fc2;
    lVar9 = 0.0;
    do {
      bVar10 = (byte)uVar12;
      if ((""[(long)(char)bVar10 + 1] & 2) == 0) {
        bVar10 = (bVar10 | 0x20) + 0xa9;
      }
      else {
        bVar10 = bVar10 - 0x30;
      }
      lVar9 = (lua_Number)((ulong)bVar10 + (long)lVar9 * 0x10);
      uVar12 = (ulong)pbVar3[1];
      pbVar3 = pbVar3 + 1;
    } while ((""[uVar12 + 1] & 0x10) != 0);
LAB_0011300a:
    bVar1 = true;
  }
  else {
    if ((""[uVar12 + 1] & 2) != 0) {
      lVar9 = 0.0;
      do {
        uVar11 = (int)(char)uVar12 - 0x30;
        if ((0xccccccccccccccb < (ulong)lVar9) &&
           ((lVar9 != 5.1488004017107686e-247 || (iVar8 + 7 < (int)uVar11)))) goto LAB_0011303f;
        lVar9 = (lua_Number)((ulong)uVar11 + (long)lVar9 * 10);
        uVar12 = (ulong)pbVar3[1];
        pbVar3 = pbVar3 + 1;
      } while ((""[uVar12 + 1] & 2) != 0);
      goto LAB_0011300a;
    }
LAB_00112fc2:
    bVar1 = false;
    lVar9 = 0.0;
  }
  pbVar3 = pbVar3 + -1;
  do {
    pbVar2 = pbVar3 + 1;
    pbVar3 = pbVar3 + 1;
  } while ((""[(ulong)*pbVar2 + 1] & 8) != 0);
  if (bVar1 && *pbVar2 == 0) {
    local_100 = (lua_Number)-(long)lVar9;
    if (iVar8 == 0) {
      local_100 = lVar9;
    }
    lVar7 = '\x03';
LAB_00113078:
    (o->value_).i = (lua_Integer)local_100;
    o->tt_ = lVar7;
    pbVar3 = pbVar3 + (1 - (long)s);
  }
  else {
LAB_0011303f:
    pbVar3 = (byte *)strpbrk(s,".xXnN");
    if ((pbVar3 == (byte *)0x0) || ((*pbVar3 & 0xdf) != 0x4e)) {
      pbVar3 = (byte *)l_str2dloc(s,&local_100,mode);
      if (pbVar3 != (byte *)0x0) {
LAB_00113071:
        lVar7 = '\x13';
        goto LAB_00113078;
      }
      pcVar4 = strchr(s,0x2e);
      if ((pcVar4 != (char *)0x0) && (sVar5 = strlen(s), sVar5 < 0xc9)) {
        strcpy(local_f8,s);
        plVar6 = localeconv();
        pcVar4[(long)(local_f8 + -(long)s)] = *plVar6->decimal_point;
        pcVar4 = l_str2dloc(local_f8,&local_100,mode_00);
        if (s != (char *)0x0 && pcVar4 != (char *)0x0) {
          pbVar3 = (byte *)(s + ((long)pcVar4 - (long)local_f8));
          goto LAB_00113071;
        }
      }
    }
    pbVar3 = (byte *)0x0;
  }
  return (size_t)pbVar3;
}

Assistant:

size_t luaO_str2num (const char *s, TValue *o) {
  lua_Integer i; lua_Number n;
  const char *e;
  if ((e = l_str2int(s, &i)) != NULL) {  /* try as an integer */
    setivalue(o, i);
  }
  else if ((e = l_str2d(s, &n)) != NULL) {  /* else try as a float */
    setfltvalue(o, n);
  }
  else
    return 0;  /* conversion failed */
  return ct_diff2sz(e - s) + 1;  /* success; return string size */
}